

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  bool bVar1;
  xpath_value_type xVar2;
  lexeme_t lVar3;
  xpath_ast_node *pxVar4;
  xpath_lexer_string *pxVar5;
  char_t *contents;
  xpath_parser *this_00;
  xpath_ast_node *pred;
  xpath_ast_node *expr;
  xpath_ast_node *last;
  xpath_ast_node *n;
  char_t *nt_name_copy;
  char_t *local_58;
  xpath_lexer_string local_50;
  undefined1 local_40 [8];
  xpath_lexer_string nt_name;
  axis_t local_28;
  nodetest_t nt_type;
  axis_t axis;
  bool axis_specified;
  xpath_ast_node *set_local;
  xpath_parser *this_local;
  
  _axis = set;
  set_local = (xpath_ast_node *)this;
  if ((set != (xpath_ast_node *)0x0) &&
     (xVar2 = xpath_ast_node::rettype(set), xVar2 != xpath_type_node_set)) {
    pxVar4 = error(this,"Step has to be applied to node set");
    return pxVar4;
  }
  nt_type._3_1_ = nodetest_none >> 0x18;
  local_28 = axis_child;
  lVar3 = xpath_lexer::current(&this->_lexer);
  if (lVar3 == lex_axis_attribute) {
    local_28 = axis_attribute;
    nt_type._3_1_ = 1;
    xpath_lexer::next(&this->_lexer);
  }
  else {
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_dot) {
      xpath_lexer::next(&this->_lexer);
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_open_square_brace) {
        pxVar4 = error(this,"Predicates are not allowed after an abbreviated step");
        return pxVar4;
      }
      pxVar4 = alloc_node(this,ast_step,_axis,axis_self,nodetest_type_node,(char_t *)0x0);
      return pxVar4;
    }
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next(&this->_lexer);
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_open_square_brace) {
        pxVar4 = error(this,"Predicates are not allowed after an abbreviated step");
        return pxVar4;
      }
      pxVar4 = alloc_node(this,ast_step,_axis,axis_parent,nodetest_type_node,(char_t *)0x0);
      return pxVar4;
    }
  }
  nt_name.end._4_4_ = nodetest_none;
  xpath_lexer_string::xpath_lexer_string((xpath_lexer_string *)local_40);
  lVar3 = xpath_lexer::current(&this->_lexer);
  if (lVar3 == lex_string) {
    pxVar5 = xpath_lexer::contents(&this->_lexer);
    local_40 = (undefined1  [8])pxVar5->begin;
    nt_name.begin = pxVar5->end;
    xpath_lexer::next(&this->_lexer);
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_double_colon) {
      if ((nt_type._3_1_ & 1) != nodetest_none >> 0x18) {
        pxVar4 = error(this,"Two axis specifiers in one step");
        return pxVar4;
      }
      local_28 = parse_axis_name(this,(xpath_lexer_string *)local_40,(bool *)((long)&nt_type + 3));
      if ((nt_type._3_1_ & 1) == nodetest_none >> 0x18) {
        pxVar4 = error(this,"Unknown axis");
        return pxVar4;
      }
      xpath_lexer::next(&this->_lexer);
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_multiply) {
        nt_name.end._4_4_ = nodetest_all;
        xpath_lexer_string::xpath_lexer_string(&local_50);
        local_40 = (undefined1  [8])local_50.begin;
        nt_name.begin = local_50.end;
        xpath_lexer::next(&this->_lexer);
      }
      else {
        lVar3 = xpath_lexer::current(&this->_lexer);
        if (lVar3 != lex_string) {
          pxVar4 = error(this,"Unrecognized node test");
          return pxVar4;
        }
        pxVar5 = xpath_lexer::contents(&this->_lexer);
        local_40 = (undefined1  [8])pxVar5->begin;
        nt_name.begin = pxVar5->end;
        xpath_lexer::next(&this->_lexer);
      }
    }
    if (nt_name.end._4_4_ == nodetest_none) {
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_open_brace) {
        xpath_lexer::next(&this->_lexer);
        lVar3 = xpath_lexer::current(&this->_lexer);
        if (lVar3 == lex_close_brace) {
          xpath_lexer::next(&this->_lexer);
          nt_name.end._4_4_ = parse_node_test_type(this,(xpath_lexer_string *)local_40);
          if (nt_name.end._4_4_ == nodetest_none) {
            pxVar4 = error(this,"Unrecognized node type");
            return pxVar4;
          }
          xpath_lexer_string::xpath_lexer_string((xpath_lexer_string *)&nt_name_copy);
          local_40 = (undefined1  [8])nt_name_copy;
          nt_name.begin = local_58;
        }
        else {
          bVar1 = xpath_lexer_string::operator==
                            ((xpath_lexer_string *)local_40,(char_t *)"processing-instruction");
          if (!bVar1) {
            pxVar4 = error(this,"Unmatched brace near node type test");
            return pxVar4;
          }
          lVar3 = xpath_lexer::current(&this->_lexer);
          if (lVar3 != lex_quoted_string) {
            pxVar4 = error(this,"Only literals are allowed as arguments to processing-instruction()"
                          );
            return pxVar4;
          }
          nt_name.end._4_4_ = nodetest_pi;
          pxVar5 = xpath_lexer::contents(&this->_lexer);
          local_40 = (undefined1  [8])pxVar5->begin;
          nt_name.begin = pxVar5->end;
          xpath_lexer::next(&this->_lexer);
          lVar3 = xpath_lexer::current(&this->_lexer);
          if (lVar3 != lex_close_brace) {
            pxVar4 = error(this,"Unmatched brace near processing-instruction()");
            return pxVar4;
          }
          xpath_lexer::next(&this->_lexer);
        }
      }
      else if ((((long)nt_name.begin - (long)local_40 < 3) || (nt_name.begin[-2] != ':')) ||
              (nt_name.begin[-1] != '*')) {
        nt_name.end._4_4_ = nodetest_name;
      }
      else {
        nt_name.begin = nt_name.begin + -1;
        nt_name.end._4_4_ = nodetest_all_in_namespace;
      }
    }
  }
  else {
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 != lex_multiply) {
      pxVar4 = error(this,"Unrecognized node test");
      return pxVar4;
    }
    nt_name.end._4_4_ = nodetest_all;
    xpath_lexer::next(&this->_lexer);
  }
  contents = alloc_string(this,(xpath_lexer_string *)local_40);
  if (contents == (char_t *)0x0) {
    this_local = (xpath_parser *)0x0;
  }
  else {
    this_00 = (xpath_parser *)alloc_node(this,ast_step,_axis,local_28,nt_name.end._4_4_,contents);
    if (this_00 == (xpath_parser *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      expr = (xpath_ast_node *)0x0;
      while (lVar3 = xpath_lexer::current(&this->_lexer), this_local = this_00,
            lVar3 == lex_open_square_brace) {
        xpath_lexer::next(&this->_lexer);
        pxVar4 = parse_expression(this,0);
        if (pxVar4 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar4 = alloc_node(this,ast_predicate,(xpath_ast_node *)0x0,pxVar4,predicate_default);
        if (pxVar4 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        lVar3 = xpath_lexer::current(&this->_lexer);
        if (lVar3 != lex_close_square_brace) {
          pxVar4 = error(this,"Expected \']\' to match an opening \'[\'");
          return pxVar4;
        }
        xpath_lexer::next(&this->_lexer);
        if (expr == (xpath_ast_node *)0x0) {
          xpath_ast_node::set_right((xpath_ast_node *)this_00,pxVar4);
          expr = pxVar4;
        }
        else {
          xpath_ast_node::set_next(expr,pxVar4);
          expr = pxVar4;
        }
      }
    }
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return 0;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return 0;

			xpath_ast_node* last = 0;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return 0;

				xpath_ast_node* pred = alloc_node(ast_predicate, 0, expr, predicate_default);
				if (!pred) return 0;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			return n;
		}